

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPTrainClient.cpp
# Opt level: O0

int __thiscall
tiger::trains::client::TCPTrainClient::getCoordinate(TCPTrainClient *this,CoordsMap *coordsMap)

{
  long lVar1;
  LineNumber *pLVar2;
  bool bVar3;
  size_t __n;
  ulong uVar4;
  pointer pRVar5;
  size_t __n_00;
  void *__buf;
  int __fd;
  LineNumber *pLVar6;
  TCPSession *pTVar7;
  ModelConvertor *this_00;
  int in_R8D;
  undefined8 uStack_240;
  DispatchAction aDStack_238 [2];
  LineNumber LStack_230;
  undefined4 uStack_224;
  string *local_220;
  undefined8 local_218;
  ModelConvertor *local_210 [2];
  char *local_200;
  int local_1f4;
  Logger *local_1f0;
  size_t *local_1e8;
  TCPTrainClient *local_1e0;
  LineNumber *local_1d8;
  Writer local_1d0;
  int local_160;
  int retVal;
  undefined1 local_150 [8];
  unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  message;
  uint32_t cmd;
  unsigned_long __vla_expr0;
  undefined4 local_130;
  size_t len;
  char buffer [255];
  CoordsMap *coordsMap_local;
  TCPTrainClient *this_local;
  
  local_1e8 = &len;
  LStack_230 = 0x24623d;
  local_1e0 = this;
  memcpy(local_1e8,"{\n \"layer\": 10\n}",0xff);
  LStack_230 = 0x246249;
  __n = strlen((char *)local_1e8);
  __n_00 = __n + 0x17 & 0xfffffffffffffff0;
  lVar1 = -__n_00;
  pLVar6 = (LineNumber *)(&stack0xfffffffffffffdd8 + lVar1);
  message._M_t.
  super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  ._M_t.
  super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  .super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>._M_head_impl._4_4_ = 10;
  local_1d8 = pLVar6;
  *(undefined4 *)pLVar6 = 10;
  local_130 = (undefined4)__n;
  *(undefined4 *)((long)&uStack_224 + lVar1) = local_130;
  *(undefined8 *)((long)&LStack_230 + lVar1) = 0x2462b9;
  memcpy((void *)((long)&local_220 + lVar1),&len,__n);
  pLVar2 = local_1d8;
  pTVar7 = &local_1e0->tcpSession;
  *(undefined8 *)((long)&LStack_230 + lVar1) = 0x2462db;
  __fd = (int)pLVar2;
  uVar4 = network::TCPSession::send(pTVar7,__fd,(void *)(__n + 8),__n_00,in_R8D);
  if ((uVar4 & 1) == 0) {
    return 8;
  }
  pTVar7 = &local_1e0->tcpSession;
  *(undefined8 *)((long)&LStack_230 + lVar1) = 0x246305;
  network::TCPSession::recv(pTVar7,__fd,__buf,__n_00,in_R8D);
  *(undefined8 *)((long)&LStack_230 + lVar1) = 0x246314;
  std::
  unique_ptr<tiger::trains::network::ResposeMessage,std::default_delete<tiger::trains::network::ResposeMessage>>
  ::unique_ptr<std::default_delete<tiger::trains::network::ResposeMessage>,void>
            (*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
               **)((long)&local_220 + lVar1),(pointer)*pLVar6);
  *(undefined8 *)((long)&LStack_230 + lVar1) = 0x246324;
  bVar3 = std::operator==(*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                            **)((long)&local_220 + lVar1),(nullptr_t)*pLVar6);
  if (!bVar3) {
    *(undefined8 *)((long)&LStack_230 + lVar1) = 0x246334;
    pRVar5 = std::
             unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
             ::operator->(*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                            **)((long)&LStack_230 + lVar1));
    if (pRVar5->result == 0) {
      local_1f0 = local_1e0->logger;
      *(undefined8 *)((long)&LStack_230 + lVar1) = 0x24637a;
      std::
      unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
      ::operator->(*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                     **)((long)&LStack_230 + lVar1));
      *(undefined8 *)((long)&LStack_230 + lVar1) = 0x24639b;
      el::Logger::info<char[15],char*>
                (*(Logger **)((long)local_210 + lVar1),*(char **)((long)&local_218 + lVar1),
                 *(char (**) [15])((long)&local_220 + lVar1),(char **)*pLVar6);
      local_210[1] = &local_1e0->convertor;
      local_210[0] = (ModelConvertor *)local_150;
      *(undefined8 *)((long)&LStack_230 + lVar1) = 0x2463c4;
      pRVar5 = std::
               unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
               ::operator->(*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                              **)((long)&LStack_230 + lVar1));
      local_200 = pRVar5->data;
      *(undefined8 *)((long)&LStack_230 + lVar1) = 0x2463db;
      std::
      unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
      ::operator->(*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                     **)((long)&LStack_230 + lVar1));
      *(undefined8 *)((long)&LStack_230 + lVar1) = 0x2463f5;
      local_1f4 = convertors::json::ModelConvertor::readCoordsMap
                            (*(ModelConvertor **)((long)local_210 + lVar1 + 8),
                             *(char **)((long)local_210 + lVar1),
                             *(int *)((long)&local_218 + lVar1 + 4),
                             *(CoordsMap **)((long)&local_220 + lVar1));
      local_160 = local_1f4;
      if (local_1f4 == 0) {
        this_local._4_4_ = 0;
        message._M_t.
        super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
        ._M_t.
        super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
        .super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>._M_head_impl._0_4_ =
             1;
      }
      else {
        *(undefined4 *)((long)aDStack_238 + lVar1) = 0;
        *(undefined8 *)((long)&uStack_240 + lVar1) = 0x24644d;
        el::base::Writer::Writer
                  (*(Writer **)((long)local_210 + lVar1),*(Level *)((long)&local_218 + lVar1 + 4),
                   *(char **)((long)&local_220 + lVar1),*pLVar6,
                   *(char **)((long)&LStack_230 + lVar1),
                   *(DispatchAction *)((long)aDStack_238 + lVar1 + 4),
                   *(VerboseLevel *)((long)&local_200 + lVar1));
        *(undefined8 *)((long)&LStack_230 + lVar1) = 0x24646d;
        local_218 = el::base::Writer::construct(&local_1d0,1,el::base::consts::kDefaultLoggerId);
        this_00 = &local_1e0->convertor;
        *(undefined8 *)((long)&LStack_230 + lVar1) = 0x246489;
        local_220 = convertors::json::ModelConvertor::getLastErrorMessage_abi_cxx11_(this_00);
        *(undefined8 *)((long)&LStack_230 + lVar1) = 0x2464a5;
        el::base::Writer::operator<<
                  (*(Writer **)((long)&local_220 + lVar1),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pLVar6);
        *(undefined8 *)((long)&LStack_230 + lVar1) = 0x2464b3;
        el::base::Writer::~Writer(*(Writer **)((long)&local_220 + lVar1));
        this_local._4_4_ = 6;
        message._M_t.
        super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
        ._M_t.
        super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
        .super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>._M_head_impl._0_4_ =
             1;
      }
      goto LAB_0024650b;
    }
  }
  *(undefined8 *)((long)&LStack_230 + lVar1) = 0x246345;
  pRVar5 = std::
           unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
           ::operator->(*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                          **)((long)&LStack_230 + lVar1));
  this_local._4_4_ = pRVar5->result;
  message._M_t.
  super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  ._M_t.
  super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  .super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>._M_head_impl._0_4_ = 1;
LAB_0024650b:
  message._M_t.
  super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  ._M_t.
  super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  .super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>._M_head_impl._0_4_ = 1;
  *(undefined8 *)((long)&LStack_230 + lVar1) = 0x246517;
  std::
  unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  ::~unique_ptr(*(unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                  **)((long)&local_220 + lVar1));
  return this_local._4_4_;
}

Assistant:

int TCPTrainClient::getCoordinate(models::CoordsMap *coordsMap)
{
    char buffer[BUFF_SIZE] = "{\n \"layer\": 10\n}";
    size_t len = strlen(buffer);

    char sendBuffer[8+len];
    uint32_t cmd = 10;

    memcpy(sendBuffer, &cmd, OFFSET_SIZE);
    memcpy(sendBuffer + OFFSET_1, &len, OFFSET_SIZE);
    memcpy(sendBuffer + OFFSET_2, buffer, len);

    if (!tcpSession.send(sendBuffer, len + OFFSET_2))
        return (int)TCPTrainClient::ErrorType::NOT_SEND;


    std::unique_ptr<network::ResposeMessage> message(tcpSession.recv());

    if (message == nullptr || message->result != 0)
        return message->result;


    logger->info(" %v\n %v", "Coordinate Map", message->data);

    int retVal = convertor.readCoordsMap(message->data, message->dataLength, coordsMap);


    if (retVal != 0)
    {
        LOG(ERROR) << convertor.getLastErrorMessage();
        return (int)TCPTrainClient::ErrorType::JSON_NO_PARSE;
    }

    return (int)TCPTrainClient::ErrorType::OKEY;


}